

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::cylinderMesh(Mesh *__return_storage_ptr__,float _radius,float _height,
                         int _radiusSegments,int _heightSegments,int _numCapSegments,bool _bCapped,
                         DrawMode _drawMode)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  int y;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  uint32_t uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar14;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar16;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  float fVar22;
  undefined1 auVar23 [12];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vec2 tcoord;
  float a;
  vec3 vert;
  int local_1b8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1a0;
  float local_19c;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  ulong local_178;
  DrawMode local_16c;
  float local_168;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_164;
  float local_160;
  float local_15c;
  vec3 local_158;
  undefined1 local_148 [16];
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  ulong local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d4;
  float local_d0;
  float local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_c8._8_8_ = local_c8._0_8_;
  local_188 = CONCAT44(in_XMM0_Db,_radius);
  uStack_180 = in_XMM0_Dc;
  uStack_17c = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  local_16c = TRIANGLE_STRIP;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    local_16c = _drawMode;
  }
  fVar7 = (float)(_numCapSegments + 1);
  if (_heightSegments < 2) {
    _heightSegments = 1;
  }
  local_c8._4_4_ = 0;
  local_c8._0_4_ = _heightSegments;
  bVar11 = 0 < _numCapSegments;
  bVar6 = bVar11 && _bCapped;
  if (!bVar11 || !_bCapped) {
    fVar7 = 1.4013e-45;
  }
  fVar8 = (float)(_radiusSegments + 1);
  local_168 = (float)(int)fVar8 + -1.0;
  local_b8 = ZEXT416((uint)(-6.2831855 / local_168));
  local_148 = ZEXT416((uint)(float)(int)(_heightSegments + 1));
  __return_storage_ptr__->m_drawMode = local_16c;
  local_d0 = (float)(int)(_heightSegments + 1) + -1.0;
  local_48 = _height * 0.5;
  local_d4 = (float)((int)fVar7 * 2) + -2.0 + local_d0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  if (bVar11 && _bCapped) {
    fVar18 = ((float)(int)fVar7 + -1.0) / local_d4;
    local_158.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_158.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
    local_158.field_2.z = 0.0;
    local_cc = (float)((int)fVar7 + -1);
    local_138 = ABS(0.0 - local_cc);
    uStack_134 = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    local_58._4_4_ = 0x80000000;
    local_58._0_4_ = -local_48;
    local_58._8_4_ = 0x80000000;
    local_58._12_4_ = 0x80000000;
    local_118._0_4_ = 0.0;
    do {
      if (-1 < _radiusSegments) {
        fVar15 = ((float)(int)local_118._0_4_ / local_cc) * (float)local_188 + 0.0;
        fVar12 = ((float)(int)local_118._0_4_ / local_cc) * fVar18 + 0.0;
        local_68._0_4_ = -(uint)(0.0 <= fVar15 || (float)local_188 < fVar15);
        local_78 = (float)local_188;
        if (fVar15 <= (float)local_188) {
          local_78 = fVar15;
        }
        uStack_74 = local_188._4_4_;
        uStack_70 = uStack_180;
        uStack_6c = uStack_17c;
        local_88._0_4_ = (float)local_188;
        if ((float)local_188 <= fVar15) {
          local_88._0_4_ = fVar15;
        }
        local_88._4_4_ = local_188._4_4_;
        local_88._8_4_ = uStack_180;
        local_88._12_4_ = uStack_17c;
        local_98._0_4_ = -(uint)(fVar15 <= 0.0 || fVar15 < (float)local_188);
        local_178 = CONCAT44(local_178._4_4_,-(uint)(0.0 <= fVar12 || fVar18 < fVar12));
        fVar15 = fVar18;
        if (fVar12 <= fVar18) {
          fVar15 = fVar12;
        }
        local_128 = (ulong)(uint)fVar15;
        uStack_120 = 0;
        uStack_11c = 0;
        local_108 = fVar18;
        if (fVar18 <= fVar12) {
          local_108 = fVar12;
        }
        uStack_104 = 0;
        uStack_100 = 0;
        uStack_fc = 0;
        local_a8 = (float)-(uint)(fVar12 <= 0.0 || fVar12 < fVar18);
        fVar12 = 0.0;
        do {
          fVar15 = 0.0;
          if (1.1920929e-07 <= local_138) {
            fVar15 = local_78;
            auVar1 = local_68;
            if ((float)local_188 < 0.0) {
              fVar15 = (float)local_88._0_4_;
              auVar1 = local_98;
            }
            if ((auVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              fVar15 = 0.0;
            }
          }
          local_198._0_4_ = fVar15;
          local_e8 = (float)(int)fVar12;
          local_f8 = (float)local_b8._0_4_ * local_e8;
          uStack_f4 = local_b8._4_4_;
          uStack_f0 = local_b8._8_4_;
          uStack_ec = local_b8._12_4_;
          fVar15 = cosf(local_f8);
          local_164.x = fVar15 * (float)local_198._0_4_;
          local_15c = sinf(local_f8);
          local_15c = local_15c * (float)local_198._0_4_;
          local_160 = (float)local_58._0_4_;
          local_1a0.x = local_e8 / local_168;
          if (1.1920929e-07 <= local_138) {
            if (0.0 <= fVar18) {
              local_19c = (float)local_128;
              if ((local_178 & 1) == 0) goto LAB_0021e55f;
            }
            else {
              local_19c = local_108;
              if (((uint)local_a8 & 1) == 0) goto LAB_0021e55f;
            }
          }
          else {
LAB_0021e55f:
            local_19c = 0.0;
          }
          local_19c = 1.0 - local_19c;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a0);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addNormal(__return_storage_ptr__,&local_158);
          fVar12 = (float)((int)fVar12 + 1);
        } while (fVar8 != fVar12);
      }
      local_118._0_4_ = local_118._0_4_ + 1;
    } while ((float)local_118._0_4_ != fVar7);
    if (local_16c == TRIANGLES) {
      if (bVar6) {
        local_f8 = 2.8026e-45;
        if (2 < (int)fVar7) {
          local_f8 = fVar7;
        }
        local_f8 = (float)((int)local_f8 - 2);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_198._8_8_;
        local_198 = auVar1 << 0x40;
        fVar12 = 1.4013e-45;
        fVar15 = fVar8;
        do {
          local_138 = fVar12;
          local_e8 = fVar15;
          iVar9 = _radiusSegments;
          if (0 < _radiusSegments) {
            do {
              if (local_198._0_4_ != 0) {
                Mesh::addIndex(__return_storage_ptr__,(int)fVar12 - 1);
                Mesh::addIndex(__return_storage_ptr__,(uint32_t)fVar12);
                Mesh::addIndex(__return_storage_ptr__,(uint32_t)fVar15);
              }
              Mesh::addIndex(__return_storage_ptr__,(uint32_t)fVar12);
              Mesh::addIndex(__return_storage_ptr__,(int)fVar15 + 1U);
              Mesh::addIndex(__return_storage_ptr__,(uint32_t)fVar15);
              fVar12 = (float)((int)fVar12 + 1);
              iVar9 = iVar9 + -1;
              fVar15 = (float)((int)fVar15 + 1U);
            } while (iVar9 != 0);
          }
          auVar1 = local_198;
          fVar13 = local_198._0_4_;
          local_198._4_4_ = 0;
          local_198._0_4_ = (int)fVar13 + 1;
          fVar15 = (float)((int)local_e8 + (int)fVar8);
          fVar12 = (float)((int)local_138 + (int)fVar8);
          local_198._8_8_ = auVar1._8_8_;
        } while (fVar13 != local_f8);
      }
    }
    else if (bVar6) {
      fVar12 = 2.8026e-45;
      if (2 < (int)fVar7) {
        fVar12 = fVar7;
      }
      local_198._0_4_ = (int)fVar12 + -2;
      uVar3 = 0;
      iVar9 = 0;
      do {
        fVar12 = fVar8;
        uVar10 = uVar3;
        if (-1 < _radiusSegments) {
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar10);
            Mesh::addIndex(__return_storage_ptr__,(int)fVar8 + uVar10);
            uVar10 = uVar10 + 1;
            fVar12 = (float)((int)fVar12 - 1);
          } while (fVar12 != 0.0);
        }
        uVar3 = uVar3 + (int)fVar8;
        bVar11 = iVar9 != local_198._0_4_;
        iVar9 = iVar9 + 1;
      } while (bVar11);
    }
    uVar2 = (int)((ulong)((long)(__return_storage_ptr__->m_vertices).
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->m_vertices).
                               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  }
  else {
    uVar2 = 0;
    fVar18 = 0.0;
  }
  local_128 = (ulong)uVar2;
  if (bVar6) {
    local_148._0_4_ = (float)local_148._0_4_ / local_d4;
  }
  else {
    local_148._4_4_ = 0;
    local_148._0_4_ = 1.0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
  }
  fVar12 = _height / local_d0;
  local_108 = (float)(int)local_c8._0_4_;
  local_a8 = -local_48;
  uStack_a4 = uStack_44 ^ 0x80000000;
  uStack_a0 = uStack_40 ^ 0x80000000;
  uStack_9c = uStack_3c ^ 0x80000000;
  local_58 = ZEXT416((uint)ABS(0.0 - local_108));
  local_118._4_4_ = local_148._4_4_;
  local_118._0_4_ = (float)local_148._0_4_ - fVar18;
  local_118._8_4_ = local_148._8_4_;
  local_118._12_4_ = local_148._12_4_;
  local_198._0_8_ = local_b8._0_8_ ^ 0x8000000080000000;
  local_198._8_4_ = local_b8._8_4_ ^ 0x80000000;
  local_198._12_4_ = local_b8._12_4_ ^ 0x80000000;
  local_178 = 0;
  do {
    local_158.field_0.x = 1.0;
    local_158.field_1.y = 0.0;
    local_158.field_2.z = 0.0;
    if (-1 < _radiusSegments) {
      fVar15 = ((float)(int)local_178 / local_108) * (float)local_118._0_4_ + fVar18;
      local_68._0_4_ = local_148._0_4_;
      if (fVar15 <= (float)local_148._0_4_) {
        local_68._0_4_ = fVar15;
      }
      local_68._4_4_ = local_148._4_4_;
      local_68._8_4_ = local_148._8_4_;
      local_68._12_4_ = local_148._12_4_;
      local_78 = (float)local_148._0_4_;
      if ((float)local_148._0_4_ <= fVar15) {
        local_78 = fVar15;
      }
      uStack_74 = local_148._4_4_;
      uStack_70 = local_148._8_4_;
      uStack_6c = local_148._12_4_;
      local_88._0_4_ = -(uint)((float)local_148._0_4_ < fVar15 || fVar18 <= fVar15);
      local_f8 = fVar12 * (float)(int)local_178 + local_a8;
      local_98._0_4_ = -(uint)(fVar15 <= fVar18 || fVar15 < (float)local_148._0_4_);
      fVar15 = 0.0;
      do {
        local_138 = (float)(int)fVar15;
        local_e8 = (float)local_b8._0_4_ * local_138;
        uStack_e4 = local_b8._4_4_;
        uStack_e0 = local_b8._8_4_;
        uStack_dc = local_b8._12_4_;
        fVar13 = cosf(local_e8);
        local_164.x = fVar13 * (float)local_188;
        local_160 = local_f8;
        local_15c = sinf(local_e8);
        local_15c = local_15c * (float)local_188;
        local_1a0.x = local_138 / local_168;
        local_19c = fVar18;
        if (1.1920929e-07 <= (float)local_58._0_4_) {
          local_19c = local_78;
          auVar1 = local_98;
          if (fVar18 <= (float)local_148._0_4_) {
            local_19c = (float)local_68._0_4_;
            auVar1 = local_88;
          }
          if ((auVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_19c = fVar18;
          }
        }
        local_19c = 1.0 - local_19c;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a0);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
        Mesh::addNormal(__return_storage_ptr__,&local_158);
        local_138 = cosf((float)local_198._0_4_);
        fVar13 = sinf((float)local_198._0_4_);
        fVar22 = (1.0 - local_138) * 0.0;
        fVar16 = fVar22 * 0.0;
        fVar27 = fVar16 + local_138;
        fVar26 = fVar13 * 0.0 + fVar22;
        fVar22 = fVar13 * -0.0 + fVar22;
        fVar19 = (1.0 - local_138) + local_138;
        fVar29 = fVar22 * 0.0;
        fVar25 = (fVar16 + fVar13) * 0.0;
        fVar30 = fVar27 * 0.0;
        fVar28 = fVar19 * 0.0;
        fVar31 = fVar26 * 0.0;
        fVar24 = (fVar16 - fVar13) * 0.0;
        aVar17.x = (fVar16 + fVar13 + fVar29 + fVar30) * local_158.field_2.z +
                   (fVar27 + fVar31 + fVar24) * local_158.field_0.x +
                   (fVar22 + fVar28 + fVar31) * local_158.field_1.y;
        aVar14.y = (fVar22 + fVar25 + fVar30) * local_158.field_2.z +
                   (fVar24 + fVar26 + fVar30) * local_158.field_0.x +
                   (fVar19 + fVar29 + fVar31) * local_158.field_1.y;
        local_158.field_2.z =
             (fVar25 + fVar29 + fVar27) * local_158.field_2.z +
             (fVar30 + fVar31 + (fVar16 - fVar13)) * local_158.field_0.x +
             (fVar28 + fVar29 + fVar26) * local_158.field_1.y;
        fVar15 = (float)((int)fVar15 + 1);
        local_158.field_0.x = aVar17.x;
        local_158.field_1.y = aVar14.y;
      } while (fVar8 != fVar15);
    }
    iVar9 = (int)local_178;
    local_178 = (ulong)(iVar9 + 1);
  } while (iVar9 != local_c8._0_4_);
  if (local_16c == TRIANGLES) {
    uVar3 = _radiusSegments + (int)local_128 + 2;
    local_1b8 = 0;
    uVar4 = local_128;
    do {
      uVar5 = uVar4 & 0xffffffff;
      local_198._0_4_ = uVar3;
      local_128 = uVar4;
      iVar9 = _radiusSegments;
      if (0 < _radiusSegments) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar5);
          uVar2 = (uint32_t)uVar5 + 1;
          uVar5 = (ulong)uVar2;
          Mesh::addIndex(__return_storage_ptr__,uVar2);
          Mesh::addIndex(__return_storage_ptr__,uVar3 - 1);
          Mesh::addIndex(__return_storage_ptr__,uVar2);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar3 - 1);
          uVar3 = uVar3 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      local_1b8 = local_1b8 + 1;
      uVar3 = local_198._0_4_ + (int)fVar8;
      uVar4 = (ulong)(uint)((int)local_128 + (int)fVar8);
    } while (local_1b8 != local_c8._0_4_);
  }
  else {
    iVar9 = 0;
    uVar4 = local_128;
    do {
      uVar5 = uVar4;
      fVar18 = fVar8;
      if (-1 < _radiusSegments) {
        do {
          uVar3 = (uint32_t)uVar5;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,(int)fVar8 + uVar3);
          uVar5 = (ulong)(uVar3 + 1);
          fVar18 = (float)((int)fVar18 - 1);
        } while (fVar18 != 0.0);
      }
      iVar9 = iVar9 + 1;
      uVar4 = (ulong)(uint)((int)uVar4 + (int)fVar8);
    } while (iVar9 != local_c8._0_4_);
  }
  if (bVar6) {
    uVar4 = ((long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    local_158.field_0.x = 0.0;
    local_158.field_1.y = 1.0;
    local_158.field_2.z = 0.0;
    local_a8 = (float)((int)fVar7 + -1);
    local_198 = ZEXT416((uint)ABS(0.0 - local_a8));
    local_c8 = ZEXT416((uint)(0.0 - (float)local_188));
    local_118 = ZEXT416((uint)(1.0 - (float)local_148._0_4_));
    local_108 = 0.0;
    do {
      if (-1 < _radiusSegments) {
        fVar12 = ((float)(int)local_108 / local_a8) * (float)local_c8._0_4_ + (float)local_188;
        fVar18 = ((float)(int)local_108 / local_a8) * (float)local_118._0_4_ +
                 (float)local_148._0_4_;
        local_f8 = (float)-(uint)((float)local_188 <= fVar12 || 0.0 < fVar12);
        auVar20 = ZEXT812(0);
        if (fVar12 <= 0.0) {
          auVar20._4_8_ = 0;
          auVar20._0_4_ = fVar12;
        }
        local_58._12_4_ = 0;
        local_58._0_12_ = auVar20;
        auVar23 = ZEXT812(0);
        if (0.0 <= fVar12) {
          auVar23._4_8_ = 0;
          auVar23._0_4_ = fVar12;
        }
        local_68._12_4_ = 0;
        local_68._0_12_ = auVar23;
        local_78 = (float)-(uint)(fVar12 <= (float)local_188 || fVar12 < 0.0);
        auVar21 = ZEXT812(0x3f800000);
        if (fVar18 <= 1.0) {
          auVar21._4_8_ = 0;
          auVar21._0_4_ = fVar18;
        }
        local_88._12_4_ = 0;
        local_88._0_12_ = auVar21;
        fVar12 = 1.0;
        if (1.0 <= fVar18) {
          fVar12 = fVar18;
        }
        local_98 = ZEXT416((uint)fVar12);
        local_178 = CONCAT44(local_178._4_4_,
                             -(uint)(1.0 < fVar18 || (float)local_148._0_4_ <= fVar18));
        local_128 = CONCAT44(local_128._4_4_,
                             -(uint)(fVar18 < 1.0 || fVar18 <= (float)local_148._0_4_));
        fVar18 = 0.0;
        do {
          fVar12 = (float)local_188;
          if (1.1920929e-07 <= (float)local_198._0_4_) {
            if ((float)local_188 <= 0.0) {
              fVar12 = (float)local_58._0_4_;
              fVar15 = local_f8;
            }
            else {
              fVar12 = (float)local_68._0_4_;
              fVar15 = local_78;
            }
            if (((uint)fVar15 & 1) == 0) {
              fVar12 = (float)local_188;
            }
          }
          local_138 = (float)(int)fVar18;
          local_e8 = (float)local_b8._0_4_ * local_138;
          uStack_e4 = local_b8._4_4_;
          uStack_e0 = local_b8._8_4_;
          uStack_dc = local_b8._12_4_;
          fVar15 = cosf(local_e8);
          local_164.x = fVar15 * fVar12;
          local_15c = sinf(local_e8);
          local_15c = local_15c * fVar12;
          local_160 = local_48;
          local_1a0.x = local_138 / local_168;
          local_19c = (float)local_148._0_4_;
          if (1.1920929e-07 <= (float)local_198._0_4_) {
            if ((float)local_148._0_4_ <= 1.0) {
              local_19c = (float)local_88._0_4_;
              uVar5 = local_178;
            }
            else {
              local_19c = (float)local_98._0_4_;
              uVar5 = local_128;
            }
            if ((uVar5 & 1) == 0) {
              local_19c = (float)local_148._0_4_;
            }
          }
          local_19c = 1.0 - local_19c;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a0);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addNormal(__return_storage_ptr__,&local_158);
          fVar18 = (float)((int)fVar18 + 1);
        } while (fVar8 != fVar18);
      }
      local_108 = (float)((int)local_108 + 1);
    } while (local_108 != fVar7);
    if (local_16c == TRIANGLES) {
      if (bVar6) {
        fVar18 = 2.8026e-45;
        if (2 < (int)fVar7) {
          fVar18 = fVar7;
        }
        local_b8._0_4_ = (int)fVar18 + -2;
        uVar3 = _radiusSegments + (int)uVar4 + 2;
        local_188 = 0;
        do {
          uVar5 = uVar4 & 0xffffffff;
          uVar10 = uVar3;
          iVar9 = _radiusSegments;
          if (0 < _radiusSegments) {
            do {
              Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar5);
              uVar2 = (uint32_t)uVar5 + 1;
              uVar5 = (ulong)uVar2;
              Mesh::addIndex(__return_storage_ptr__,uVar2);
              Mesh::addIndex(__return_storage_ptr__,uVar10 - 1);
              if (2 < (int)fVar7) {
                Mesh::addIndex(__return_storage_ptr__,uVar2);
                Mesh::addIndex(__return_storage_ptr__,uVar10);
                Mesh::addIndex(__return_storage_ptr__,uVar10 - 1);
              }
              uVar10 = uVar10 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          iVar9 = (int)local_188;
          local_188 = (ulong)(iVar9 + 1);
          uVar3 = uVar3 + (int)fVar8;
          uVar4 = (ulong)(uint)((int)uVar4 + (int)fVar8);
        } while (iVar9 != local_b8._0_4_);
      }
    }
    else if (bVar6) {
      fVar18 = 2.8026e-45;
      if (2 < (int)fVar7) {
        fVar18 = fVar7;
      }
      local_188 = CONCAT44(local_188._4_4_,(int)fVar18 + -2);
      iVar9 = 0;
      do {
        uVar5 = uVar4;
        fVar7 = fVar8;
        if (-1 < _radiusSegments) {
          do {
            uVar3 = (uint32_t)uVar5;
            Mesh::addIndex(__return_storage_ptr__,uVar3);
            Mesh::addIndex(__return_storage_ptr__,(int)fVar8 + uVar3);
            uVar5 = (ulong)(uVar3 + 1);
            fVar7 = (float)((int)fVar7 - 1);
          } while (fVar7 != 0.0);
        }
        uVar4 = (ulong)(uint)((int)uVar4 + (int)fVar8);
        bVar11 = (float)iVar9 != (float)local_188;
        iVar9 = iVar9 + 1;
      } while (bVar11);
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh cylinderMesh( float _radius, float _height, int _radiusSegments, int _heightSegments, int _numCapSegments, bool _bCapped, DrawMode _drawMode ) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;
        
    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    int capSegs = _numCapSegments;
    capSegs = capSegs+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    if ( capSegs < 2 ) _bCapped = false;
    if (!_bCapped) capSegs=1;

    float angleIncRadius = -1 * (TAU/((float)_radiusSegments-1.f));
    float heightInc = _height/((float)_heightSegments-1.f);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec2 tcoord;
    glm::vec3 normal;
    glm::vec3 up(0,1,0);

    std::size_t vertOffset = 0;

    float maxTexY   = _heightSegments-1.f;
    if (capSegs > 0)
        maxTexY += (capSegs*2)-2.f;
        
    float maxTexYNormalized = (capSegs-1.f) / maxTexY;

    // add the top cap //
    if (_bCapped && capSegs > 0) {
        normal = {0.f, -1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, 0.0, _radius, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = -halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, 0, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    if (y > 0) {
                        // first triangle //
                        mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }

                    // second triangle //
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();

    }

    //maxTexY            = _heightSegments-1.f + capSegs-1.f;
    float minTexYNormalized = 0;
    if (_bCapped) minTexYNormalized = maxTexYNormalized;
    maxTexYNormalized   = 1.f;
    if (_bCapped) maxTexYNormalized = (_heightSegments) / maxTexY;

    // cylinder vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        normal = {1.f, 0.f, 0.f};
        for (int ix = 0; ix < _radiusSegments; ix++) {

            //newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius);
            vert.x = cos(ix*angleIncRadius) * _radius;
            vert.y = heightInc*float(iy) - halfH;
            vert.z = sin(ix*angleIncRadius) * _radius;

            tcoord.x = float(ix)/(float(_radiusSegments)-1.f);
            tcoord.y = 1.f - remap(iy, 0, _heightSegments-1, minTexYNormalized, maxTexYNormalized, true );

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );

            normal = glm::rotate(normal, -angleIncRadius, up);

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                // first triangle //
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset);
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    } else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // add the bottom cap
    if (_bCapped && capSegs > 0) {
        minTexYNormalized = maxTexYNormalized;
        maxTexYNormalized   = 1.f;

        normal = {0.f, 1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, _radius, 0.0, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, minTexYNormalized, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs -1 && capSegs > 2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();
    }
    
    mesh.computeTangents();

    return mesh;
}